

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_lazy_message_field_lite.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableLazyMessageFieldLiteGenerator::GenerateParsingCode
          (ImmutableLazyMessageFieldLiteGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  
  variables = &(this->super_ImmutableMessageFieldLiteGenerator).variables_;
  io::Printer::Print(printer,variables,
                     "if ($name$_ == null) {\n  $name$_ = new com.google.protobuf.LazyFieldLite();\n}\n$name$_.mergeFrom(input, extensionRegistry);\n"
                    );
  io::Printer::Print(printer,variables,"$set_has_field_bit_message$\n");
  return;
}

Assistant:

void ImmutableLazyMessageFieldLiteGenerator::
GenerateParsingCode(io::Printer* printer) const {
  printer->Print(variables_,
    "if ($name$_ == null) {\n"
    "  $name$_ = new com.google.protobuf.LazyFieldLite();\n"
    "}\n"
    "$name$_.mergeFrom(input, extensionRegistry);\n");
  printer->Print(variables_,
    "$set_has_field_bit_message$\n");
}